

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

int ProcessThread::shutdown(int __fd,int __how)

{
  if (sProcessThread != (ProcessThread *)0x0) {
    wakeup(Stop);
    Thread::join(&sProcessThread->super_Thread);
    if (sProcessThread != (ProcessThread *)0x0) {
      (*(sProcessThread->super_Thread)._vptr_Thread[1])();
    }
    sProcessThread = (ProcessThread *)0x0;
  }
  return 0x310818;
}

Assistant:

void ProcessThread::shutdown()
{
    // called from static destructor, can't use mutex
    if (sProcessThread) {
        wakeup(Stop);
        sProcessThread->join();
        delete sProcessThread;
        sProcessThread = 0;
    }
}